

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::SimpleModifier::SimpleModifier
          (SimpleModifier *this,SimpleFormatter *simpleFormatter,Field field,bool strong,
          Parameters parameters)

{
  UnicodeString *this_00;
  short sVar1;
  char16_t cVar2;
  int offset;
  int iVar3;
  char16_t *pcVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  
  uVar7 = parameters._8_8_;
  (this->super_Modifier)._vptr_Modifier = (_func_int **)&PTR__SimpleModifier_003a7ab0;
  this_00 = &this->fCompiledPattern;
  UnicodeString::UnicodeString(this_00,&simpleFormatter->compiledPattern);
  this->fField = field;
  this->fStrong = strong;
  this->fPrefixLength = 0;
  this->fSuffixOffset = -1;
  this->fSuffixLength = 0;
  (this->fParameters).obj = parameters.obj;
  (this->fParameters).signum = (char)uVar7;
  *(int3 *)&(this->fParameters).field_0x9 = (int3)((ulong)uVar7 >> 8);
  (this->fParameters).plural = (int)((ulong)uVar7 >> 0x20);
  pcVar4 = UnicodeString::getBuffer(this_00);
  sVar1 = (this->fCompiledPattern).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar6 = (this->fCompiledPattern).fUnion.fFields.fLength;
  }
  else {
    iVar6 = (int)sVar1 >> 5;
  }
  if ((iVar6 == 0) || (*pcVar4 == L'\0')) {
    cVar2 = UnicodeString::doCharAt(this_00,1);
    this->fPrefixLength = (ushort)cVar2 - 0x100;
    this->fSuffixOffset = -1;
    iVar6 = 0;
  }
  else {
    cVar2 = UnicodeString::doCharAt(this_00,1);
    if (cVar2 == L'\0') {
      this->fPrefixLength = 0;
      offset = 2;
      iVar3 = 3;
    }
    else {
      cVar2 = UnicodeString::doCharAt(this_00,1);
      this->fPrefixLength = (ushort)cVar2 - 0x100;
      offset = (ushort)cVar2 - 0xfd;
      iVar3 = offset;
    }
    this->fSuffixOffset = offset;
    sVar1 = (this->fCompiledPattern).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (this->fCompiledPattern).fUnion.fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    iVar6 = 0;
    if (iVar3 < iVar5) {
      cVar2 = UnicodeString::doCharAt(this_00,offset);
      iVar6 = (ushort)cVar2 - 0x100;
    }
  }
  this->fSuffixLength = iVar6;
  return;
}

Assistant:

SimpleModifier::SimpleModifier(const SimpleFormatter &simpleFormatter, Field field, bool strong,
                               const Modifier::Parameters parameters)
        : fCompiledPattern(simpleFormatter.compiledPattern), fField(field), fStrong(strong),
          fParameters(parameters) {
    int32_t argLimit = SimpleFormatter::getArgumentLimit(
            fCompiledPattern.getBuffer(), fCompiledPattern.length());
    if (argLimit == 0) {
        // No arguments in compiled pattern
        fPrefixLength = fCompiledPattern.charAt(1) - ARG_NUM_LIMIT;
        U_ASSERT(2 + fPrefixLength == fCompiledPattern.length());
        // Set suffixOffset = -1 to indicate no arguments in compiled pattern.
        fSuffixOffset = -1;
        fSuffixLength = 0;
    } else {
        U_ASSERT(argLimit == 1);
        if (fCompiledPattern.charAt(1) != 0) {
            // Found prefix
            fPrefixLength = fCompiledPattern.charAt(1) - ARG_NUM_LIMIT;
            fSuffixOffset = 3 + fPrefixLength;
        } else {
            // No prefix
            fPrefixLength = 0;
            fSuffixOffset = 2;
        }
        if (3 + fPrefixLength < fCompiledPattern.length()) {
            // Found suffix
            fSuffixLength = fCompiledPattern.charAt(fSuffixOffset) - ARG_NUM_LIMIT;
        } else {
            // No suffix
            fSuffixLength = 0;
        }
    }
}